

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmatch.cpp
# Opt level: O1

bool __thiscall Lmatch::getMatch(Lmatch *this,Pattern *pg,Graph *dg,Graph *dest)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer psVar3;
  pointer piVar4;
  pointer pNVar5;
  byte bVar6;
  undefined1 auVar7 [8];
  Graph *pGVar8;
  int iVar9;
  uint uVar10;
  _Rb_tree_node_base *p_Var11;
  _Base_ptr p_Var12;
  ostream *poVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  _Alloc_hider _Var17;
  Pattern *pPVar18;
  long lVar19;
  size_type __n;
  ulong uVar20;
  bool bVar21;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> q;
  vector<bool,_std::allocator<bool>_> nodeMatch;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  edgeMatch;
  Kmatrix km;
  set<int,_std::less<int>,_std::allocator<int>_> nodes;
  allocator_type local_262;
  allocator_type local_261;
  undefined1 local_260 [8];
  uint *local_258;
  _Bit_type *local_250;
  uint local_248 [2];
  _Bit_pointer local_240;
  Graph *local_238;
  Pattern *local_230;
  _Rb_tree_color local_228 [2];
  undefined1 *local_220;
  _Bit_type *local_218;
  undefined1 local_210 [16];
  Graph *local_200;
  vector<bool,_std::allocator<bool>_> local_1f8;
  _Base_ptr local_1d0;
  _Rb_tree_node_base *local_1c8;
  string local_1c0;
  string local_1a0;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_180;
  Kmatrix local_168;
  string local_140;
  Node local_120;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_e0;
  Node local_b0;
  Node local_70;
  
  local_168.M.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.M.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.M.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_200 = dest;
  iVar9 = Pattern::getT(pg);
  Kmatrix::calMatrix(&local_168,&pg->super_Graph,dg,iVar9);
  local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e0._M_impl.super__Rb_tree_header._M_header;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_260 = (undefined1  [8])((ulong)local_260 & 0xffffffffffffff00);
  local_238 = dg;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_1f8,
             (long)(int)((ulong)((long)(pg->super_Graph).nodes.
                                       super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(pg->super_Graph).nodes.
                                      super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 6),(bool *)local_260,
             (allocator_type *)local_228);
  __n = (size_type)
        (int)((ulong)((long)(pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 6);
  local_228[0] = CONCAT31(local_228[0]._1_3_,1);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_260,__n,(bool *)local_228,&local_261);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector(&local_180,__n,(value_type *)local_260,&local_262);
  if (local_260 != (undefined1  [8])0x0) {
    operator_delete((void *)local_260);
    local_260 = (undefined1  [8])0x0;
    local_258 = (uint *)((ulong)local_258 & 0xffffffff00000000);
    local_250 = (_Bit_type *)0x0;
    local_248[0] = 0;
    local_240 = (_Bit_pointer)0x0;
  }
  local_230 = pg;
  if (0 < (int)((ulong)((long)(pg->super_Graph).nodes.
                              super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    lVar15 = 0;
    do {
      psVar3 = (local_230->super_Graph).edges.
               super__Vector_base<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (p_Var11 = *(_Base_ptr *)((long)&psVar3[lVar15]._M_t._M_impl.super__Rb_tree_header + 0x10)
          ; p_Var11 != &psVar3[lVar15]._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
        local_260._4_4_ = (undefined4)((ulong)local_260 >> 0x20);
        local_260._0_4_ = p_Var11[1]._M_color;
        local_258 = local_248;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,p_Var11[1]._M_parent,
                   (long)&(p_Var11[1]._M_parent)->_M_color + (long)&(p_Var11[1]._M_left)->_M_color);
        uVar14 = (ulong)(int)local_260._0_4_;
        uVar20 = uVar14 + 0x3f;
        if (-1 < (long)uVar14) {
          uVar20 = uVar14;
        }
        bVar6 = local_260[0] & 0x3f;
        puVar1 = local_180.
                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar15].
                 super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_start.super__Bit_iterator_base._M_p +
                 ((long)uVar20 >> 6) +
                 (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
        *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        if (local_258 != local_248) {
          operator_delete(local_258);
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (int)((ulong)((long)(local_230->super_Graph).nodes.
                                          super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                   (long)(local_230->super_Graph).nodes.
                                         super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                         super__Vector_impl_data._M_start) >> 6));
  }
  pPVar18 = local_230;
  if (0 < (int)((ulong)((long)(local_230->super_Graph).nodes.
                              super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(local_230->super_Graph).nodes.
                             super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 6)) {
    lVar15 = 0;
    do {
      if ((pPVar18->weight).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar15] == -1) {
        iVar9 = Pattern::getT(pPVar18);
        (pPVar18->weight).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar15] = iVar9 + 1;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (int)((ulong)((long)(pPVar18->super_Graph).nodes.
                                          super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                   (long)(pPVar18->super_Graph).nodes.
                                         super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                         super__Vector_impl_data._M_start) >> 6));
  }
  if (0 < (int)((ulong)((long)(pPVar18->super_Graph).nodes.
                              super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(pPVar18->super_Graph).nodes.
                             super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 6)) {
    uVar20 = 0;
    do {
      local_260 = (undefined1  [8])((ulong)local_260 & 0xffffffff00000000);
      if (0 < (int)((ulong)((long)(local_238->nodes).super__Vector_base<Node,_std::allocator<Node>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_238->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 6)) {
        iVar9 = 0;
        do {
          if ((local_230->weight).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar20] <=
              local_168.M.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar20].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [iVar9]) {
            local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar20 >> 6] =
                 local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar20 >> 6] |
                 1L << ((byte)uVar20 & 0x3f);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_e0,(int *)local_260);
          }
          iVar9 = local_260._0_4_ + 1;
          local_260._0_4_ = iVar9;
        } while (iVar9 < (int)((ulong)((long)(local_238->nodes).
                                             super__Vector_base<Node,_std::allocator<Node>_>._M_impl
                                             .super__Vector_impl_data._M_finish -
                                      (long)(local_238->nodes).
                                            super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                            super__Vector_impl_data._M_start) >> 6));
      }
      uVar20 = uVar20 + 1;
    } while ((long)uVar20 <
             (long)(int)((ulong)((long)(local_230->super_Graph).nodes.
                                       super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(local_230->super_Graph).nodes.
                                      super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 6));
  }
  pPVar18 = local_230;
  for (p_Var11 = local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var11 != &local_e0._M_impl.super__Rb_tree_header;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
    Graph::insertNode(local_200,
                      (local_238->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                      super__Vector_impl_data._M_start + (int)p_Var11[1]._M_color);
  }
  if (0 < (int)((ulong)((long)(pPVar18->super_Graph).nodes.
                              super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(pPVar18->super_Graph).nodes.
                             super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 6)) {
    lVar15 = 0;
    do {
      psVar3 = (pPVar18->super_Graph).edges.
               super__Vector_base<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1d0 = &psVar3[lVar15]._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var12 = *(_Base_ptr *)((long)&psVar3[lVar15]._M_t._M_impl.super__Rb_tree_header + 0x10);
      if (p_Var12 != local_1d0) {
        do {
          local_260._0_4_ = p_Var12[1]._M_color;
          local_258 = local_248;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_258,p_Var12[1]._M_parent,
                     (long)&(p_Var12[1]._M_parent)->_M_color + (long)&(p_Var12[1]._M_left)->_M_color
                    );
          local_1c8 = p_Var12;
          if (0 < (int)((ulong)((long)(local_238->nodes).
                                      super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)(local_238->nodes).
                                     super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 6)) {
            lVar19 = 0;
            do {
              psVar3 = (local_238->edges).
                       super__Vector_base<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              p_Var11 = *(_Base_ptr *)
                         ((long)&psVar3[lVar19]._M_t._M_impl.super__Rb_tree_header + 0x10);
              while (p_Var11 != &psVar3[lVar19]._M_t._M_impl.super__Rb_tree_header._M_header) {
                local_228[0] = p_Var11[1]._M_color;
                local_220 = local_210;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_220,p_Var11[1]._M_parent,
                           (long)&(p_Var11[1]._M_parent)->_M_color +
                           (long)&(p_Var11[1]._M_left)->_M_color);
                auVar7 = local_260;
                piVar4 = (pPVar18->weight).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (piVar4[lVar15] <=
                    local_168.M.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar15].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[lVar19]) {
                  uVar20 = (ulong)(int)local_260._0_4_;
                  if (((piVar4[uVar20] <=
                        local_168.M.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar20].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(int)local_228[0]]) &&
                      (local_250 == local_218)) &&
                     ((local_250 == (_Bit_type *)0x0 ||
                      (iVar9 = bcmp(local_258,local_220,(size_t)local_250), iVar9 == 0)))) {
                    pGVar8 = local_238;
                    uVar14 = uVar20 + 0x3f;
                    if (-1 < (long)uVar20) {
                      uVar14 = uVar20;
                    }
                    puVar1 = local_180.
                             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar15].
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                             ((long)uVar14 >> 6) +
                             (ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) +
                             0xffffffffffffffff;
                    *puVar1 = *puVar1 | 1L << (auVar7[0] & 0x3f);
                    pNVar5 = (local_238->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
                    _Var17._M_p = pNVar5[lVar19].id._M_dataplus._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_1a0,_Var17._M_p,
                               _Var17._M_p + pNVar5[lVar19].id._M_string_length);
                    pNVar5 = (pGVar8->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl
                             .super__Vector_impl_data._M_start;
                    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                    _Var17._M_p = pNVar5[(int)local_228[0]].id._M_dataplus._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_1c0,_Var17._M_p,
                               _Var17._M_p + pNVar5[(int)local_228[0]].id._M_string_length);
                    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_140,local_220,
                               (undefined1 *)((long)local_218 + (long)local_220));
                    Graph::insertEdge(local_200,&local_1a0,&local_1c0,&local_140);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_140._M_dataplus._M_p != &local_140.field_2) {
                      operator_delete(local_140._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                      operator_delete(local_1c0._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                      operator_delete(local_1a0._M_dataplus._M_p);
                    }
                  }
                }
                if (local_220 != local_210) {
                  operator_delete(local_220);
                }
                p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
                pPVar18 = local_230;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < (int)((ulong)((long)(local_238->nodes).
                                                  super__Vector_base<Node,_std::allocator<Node>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(local_238->nodes).
                                                 super__Vector_base<Node,_std::allocator<Node>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 6));
          }
          if (local_258 != local_248) {
            operator_delete(local_258);
          }
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(local_1c8);
        } while (p_Var12 != local_1d0);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (int)((ulong)((long)(pPVar18->super_Graph).nodes.
                                          super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                   (long)(pPVar18->super_Graph).nodes.
                                         super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                         super__Vector_impl_data._M_start) >> 6));
  }
  pNVar5 = (pPVar18->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)(pPVar18->super_Graph).nodes.
                                super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pNVar5) >> 6);
  bVar21 = (int)uVar10 < 1;
  if (0 < (int)uVar10) {
    uVar20 = (ulong)(uVar10 & 0x7fffffff);
    uVar14 = 0;
    do {
      if ((local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
        paVar2 = &local_70.id.field_2;
        _Var17._M_p = pNVar5[uVar14].id._M_dataplus._M_p;
        local_70.id._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,_Var17._M_p,_Var17._M_p + pNVar5[uVar14].id._M_string_length)
        ;
        local_70.num = pNVar5[uVar14].num;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_70.labels,&pNVar5[uVar14].labels);
        poVar13 = operator<<((ostream *)&std::cout,&local_70);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_70.labels);
        _Var17._M_p = local_70.id._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.id._M_dataplus._M_p != paVar2) {
LAB_0010b8b1:
          operator_delete(_Var17._M_p);
        }
        break;
      }
      lVar15 = 0x28;
      uVar16 = 0;
      do {
        if ((local_180.
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar14].
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
             super__Bit_iterator_base._M_p[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
          local_120.id._M_dataplus._M_p = (pointer)&local_120.id.field_2;
          _Var17._M_p = pNVar5[uVar14].id._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_120,_Var17._M_p,
                     _Var17._M_p + pNVar5[uVar14].id._M_string_length);
          local_120.num = pNVar5[uVar14].num;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_120.labels,&pNVar5[uVar14].labels);
          poVar13 = operator<<((ostream *)&std::cout,&local_120);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," --->>> ",8);
          pNVar5 = (pPVar18->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          paVar2 = &local_b0.id.field_2;
          lVar19 = *(long *)((long)pNVar5 + lVar15 + -0x28);
          local_b0.id._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,lVar19,*(long *)((long)pNVar5 + lVar15 + -0x20) + lVar19);
          local_b0.num = *(int *)((long)pNVar5 + lVar15 + -8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_b0.labels,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&(pNVar5->id)._M_dataplus._M_p + lVar15));
          poVar13 = operator<<(poVar13,&local_b0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_b0.labels);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0.id._M_dataplus._M_p != paVar2) {
            operator_delete(local_b0.id._M_dataplus._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_120.labels);
          _Var17._M_p = local_120.id._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120.id._M_dataplus._M_p != &local_120.id.field_2) goto LAB_0010b8b1;
          goto LAB_0010b8b6;
        }
        uVar16 = uVar16 + 1;
        lVar15 = lVar15 + 0x40;
      } while (uVar20 != uVar16);
      uVar14 = uVar14 + 1;
      bVar21 = uVar20 <= uVar14;
    } while (uVar14 != uVar20);
  }
LAB_0010b8b6:
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_180);
  if (local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_1f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_e0);
  Kmatrix::~Kmatrix(&local_168);
  return bVar21;
}

Assistant:

bool Lmatch::getMatch(Pattern &pg, Graph &dg, Graph &dest) {
    Kmatrix km;

    km.calMatrix(pg, dg, pg.getT());

    set<int> nodes;

    vector<bool> nodeMatch(pg.nodeNum(), false);
    vector<vector<bool>> edgeMatch(pg.nodeNum(), vector<bool>(pg.nodeNum(), true));
    for (int i = 0; i < pg.nodeNum(); i++) {
        for (auto p : pg.edges[i])
            edgeMatch[i][p.first] = false;
    }

    for (int i = 0; i < pg.nodeNum(); i++)
        if (pg.weight[i] == -1)
            pg.weight[i] = pg.getT() + 1;

    for (int i = 0; i < pg.nodeNum(); i++) {
        for (int j = 0; j < dg.nodeNum(); j++) {
            if (km.M[i][j] >= pg.weight[i]) {
                nodeMatch[i] = true;
                nodes.insert(j);
            }
        }
    }

    for (int i : nodes) {
        dest.insertNode(dg.nodes[i]);
    }

    for (int i = 0; i < pg.nodeNum(); i++) {
        for (pair<int, string> p : pg.edges[i]) {
            for (int j = 0; j < dg.nodeNum(); j++) {
                for (pair<int, string> q : dg.edges[j]) {
                    if (km.M[i][j] >= pg.weight[i] && km.M[p.first][q.first] >= pg.weight[p.first]
                            && p.second == q.second) {
                        edgeMatch[i][p.first] = true;
                        dest.insertEdge(dg.nodes[j].id, dg.nodes[q.first].id, q.second);
                    }
                }
            }
        }
    }

    for (int i = 0; i < pg.nodeNum(); i++) {
        if (nodeMatch[i] == false) {
            cout << pg.nodes[i] << endl;
            return false;
        }
        for (int j = 0; j < pg.nodeNum(); j++) {
            if (edgeMatch[i][j] == false) {
                cout << pg.nodes[i] << " --->>> " << pg.nodes[j] << endl;
                return false;
            }
        }
    }
    return true;
}